

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  ImFont *this_00;
  ImFont **ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = (this->Fonts).Size;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      this_00 = (this->Fonts).Data[lVar2];
      if (this_00 != (ImFont *)0x0) {
        ImFont::~ImFont(this_00);
        ImGui::MemFree(this_00);
        iVar1 = (this->Fonts).Size;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  ptr = (this->Fonts).Data;
  if (ptr != (ImFont **)0x0) {
    (this->Fonts).Size = 0;
    (this->Fonts).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->Fonts).Data = (ImFont **)0x0;
  }
  this->TexReady = false;
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    Fonts.clear_delete();
    TexReady = false;
}